

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NPrintNamespaces(xmlNsPtr ns,xmlC14NCtxPtr ctx)

{
  xmlC14NCtxPtr ctx_local;
  xmlNsPtr ns_local;
  
  if ((ns == (xmlNsPtr)0x0) || (ctx == (xmlC14NCtxPtr)0x0)) {
    xmlC14NErrParam("writing namespaces");
    ns_local._4_4_ = 0;
  }
  else {
    if (ns->prefix == (xmlChar *)0x0) {
      xmlOutputBufferWriteString(ctx->buf," xmlns=");
    }
    else {
      xmlOutputBufferWriteString(ctx->buf," xmlns:");
      xmlOutputBufferWriteString(ctx->buf,(char *)ns->prefix);
      xmlOutputBufferWriteString(ctx->buf,"=");
    }
    if (ns->href == (xmlChar *)0x0) {
      xmlOutputBufferWriteString(ctx->buf,"\"\"");
    }
    else {
      xmlBufWriteQuotedString(ctx->buf->buffer,ns->href);
    }
    ns_local._4_4_ = 1;
  }
  return ns_local._4_4_;
}

Assistant:

static int
xmlC14NPrintNamespaces(const xmlNsPtr ns, xmlC14NCtxPtr ctx)
{

    if ((ns == NULL) || (ctx == NULL)) {
        xmlC14NErrParam("writing namespaces");
        return 0;
    }

    if (ns->prefix != NULL) {
        xmlOutputBufferWriteString(ctx->buf, " xmlns:");
        xmlOutputBufferWriteString(ctx->buf, (const char *) ns->prefix);
        xmlOutputBufferWriteString(ctx->buf, "=");
    } else {
        xmlOutputBufferWriteString(ctx->buf, " xmlns=");
    }
    if(ns->href != NULL) {
	xmlBufWriteQuotedString(ctx->buf->buffer, ns->href);
    } else {
    	xmlOutputBufferWriteString(ctx->buf, "\"\"");
    }
    return (1);
}